

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall luna::CodeGenerateVisitor::LeaveBlock(CodeGenerateVisitor *this)

{
  GenerateBlock *pGVar1;
  Function *this_00;
  _Hash_node_base *p_Var2;
  GenerateFunction *pGVar3;
  size_t sVar4;
  
  pGVar1 = this->current_function_->current_block_;
  this_00 = this->current_function_->function_;
  sVar4 = Function::OpCodeSize(this_00);
  for (p_Var2 = (pGVar1->names_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    Function::AddLocalVar
              (this_00,(String *)p_Var2[1]._M_nxt,*(int *)&p_Var2[2]._M_nxt,
               *(int *)((long)&p_Var2[2]._M_nxt + 4),(int)sVar4);
  }
  Function::AddInstruction
            (this_00,(Instruction)
                     ((pGVar1->register_start_id_ & 0xffU) * 0x10000 +
                      (this->current_function_->register_id_ & 0xffU) * 0x100 + 0x2000000),0);
  pGVar3 = this->current_function_;
  pGVar3->current_block_ = pGVar1->parent_;
  pGVar3->register_id_ = pGVar1->register_start_id_;
  std::
  _Hashtable<luna::String_*,_std::pair<luna::String_*const,_luna::LocalNameInfo>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>,_std::__detail::_Select1st,_std::equal_to<luna::String_*>,_std::hash<luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(pGVar1->names_)._M_h);
  operator_delete(pGVar1);
  return;
}

Assistant:

void LeaveBlock()
        {
            auto block = current_function_->current_block_;

            // Add all variables in block to the function local variable list
            auto function = current_function_->function_;
            auto end_pc = function->OpCodeSize();
            for (auto it = block->names_.begin(); it != block->names_.end(); ++it)
            {
                function->AddLocalVar(it->first, it->second.register_id_,
                                      it->second.begin_pc_, end_pc);
            }

            // add one instruction to close block
            auto instruction = Instruction::ABCode(OpType_FillNil, block->register_start_id_, current_function_->register_id_);
            function->AddInstruction(instruction, 0);

            current_function_->current_block_ = block->parent_;
            current_function_->register_id_ = block->register_start_id_;
            delete block;
        }